

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_map.cpp
# Opt level: O0

void anon_unknown.dwarf_48dd3::SequenceTester<QList<int>_>::exec(void)

{
  initializer_list<QString> args;
  initializer_list<int> args_00;
  Type TVar1;
  PromiseType PVar2;
  PromiseType PVar3;
  PromiseType PVar4;
  QString *local_178;
  QString local_148;
  QString local_130;
  QString local_118;
  undefined1 local_100 [40];
  QList<QString> local_d8;
  QList<QString> local_b8;
  int local_8c [3];
  iterator local_80;
  undefined8 local_78;
  QList<int> local_70;
  QPromise<QList<int>_> local_58;
  QPromise<QList<QString>_> local_48;
  QPromise<QList<QString>_> local_38;
  QPromise<QList<QByteArray>_> local_28;
  undefined1 local_18 [8];
  PromiseType p;
  
  local_8c[0] = 0x2a;
  local_8c[1] = 0x2b;
  local_8c[2] = 0x2c;
  local_80 = local_8c;
  local_78 = 3;
  args_00._M_len = 3;
  args_00._M_array = local_80;
  QList<int>::QList(&local_70,args_00);
  TVar1 = QtPromise::resolve<QList<int>>((QtPromise *)&local_58,&local_70);
  PVar2 = QtPromise::QPromise<QList<int>>::
          map<(anonymous_namespace)::SequenceTester<QList<int>>::exec()::_lambda(int,___)_1_>
                    ((QPromise<QList<int>> *)&local_48,&local_58,
                     TVar1.super_QPromiseBase<QList<int>_>.m_d.d.d);
  PVar3 = QtPromise::QPromise<QList<QString>>::
          map<(anonymous_namespace)::SequenceTester<QList<int>>::exec()::_lambda(QString_const&,int)_1_>
                    ((QPromise<QList<QString>> *)&local_38,&local_48,
                     PVar2.super_QPromiseBase<QList<QString>_>.m_d.d.d);
  PVar4 = QtPromise::QPromise<QList<QString>>::
          map<(anonymous_namespace)::SequenceTester<QList<int>>::exec()::_lambda(QString_const&,___)_1_>
                    ((QPromise<QList<QString>> *)&local_28,&local_38,
                     PVar3.super_QPromiseBase<QList<QString>_>.m_d.d.d);
  QtPromise::QPromise<QList<QByteArray>>::
  map<(anonymous_namespace)::SequenceTester<QList<int>>::exec()::_lambda(QByteArray_const&,___)_1_>
            ((QPromise<QList<QByteArray>> *)local_18,&local_28,
             PVar4.super_QPromiseBase<QList<QByteArray>_>.m_d.d.d);
  QtPromise::QPromise<QList<QByteArray>_>::~QPromise(&local_28);
  QtPromise::QPromise<QList<QString>_>::~QPromise(&local_38);
  QtPromise::QPromise<QList<QString>_>::~QPromise(&local_48);
  QtPromise::QPromise<QList<int>_>::~QPromise(&local_58);
  QList<int>::~QList(&local_70);
  local_d8.d.d = (Data *)0x0;
  local_d8.d.ptr = (QString *)0x0;
  local_d8.d.size = 0;
  QList<QString>::QList(&local_d8);
  waitForValue<QList<QString>>(&local_b8,(QPromise<QList<QString>_> *)local_18,&local_d8);
  QString::QString(&local_148,"0:43!");
  QString::QString(&local_130,"1:44!");
  QString::QString(&local_118,"2:45!");
  local_100._0_8_ = &local_148;
  local_100._8_8_ = (char16_t *)0x3;
  args._M_len = 3;
  args._M_array = (iterator)local_100._0_8_;
  QList<QString>::QList((QList<QString> *)(local_100 + 0x10),args);
  QTest::qCompare<QString>
            (&local_b8,(QList<QString> *)(local_100 + 0x10),"waitForValue(p, QVector<QString>{})",
             "(QVector<QString>{\"0:43!\", \"1:44!\", \"2:45!\"})",
             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_map.cpp"
             ,0x37);
  QList<QString>::~QList((QList<QString> *)(local_100 + 0x10));
  local_178 = (QString *)local_100;
  do {
    local_178 = local_178 + -1;
    QString::~QString(local_178);
  } while (local_178 != &local_148);
  QList<QString>::~QList(&local_b8);
  QList<QString>::~QList(&local_d8);
  QtPromise::QPromise<QList<QString>_>::~QPromise((QPromise<QList<QString>_> *)local_18);
  return;
}

Assistant:

static void exec()
    {
        auto p = QtPromise::resolve(Sequence{42, 43, 44})
                     .map([](int v, ...) {
                         return QString::number(v + 1);
                     })
                     .map([](const QString& v, int i) {
                         return QtPromise::resolve(QString{"%1:%2"}.arg(i).arg(v));
                     })
                     .map([](const QString& v, ...) {
                         return QtPromise::resolve((v + "!").toUtf8());
                     })
                     .map([](const QByteArray& v, ...) {
                         return QString::fromUtf8(v);
                     });

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QVector<QString>>>::value));
        QCOMPARE(waitForValue(p, QVector<QString>{}),
                 (QVector<QString>{"0:43!", "1:44!", "2:45!"}));
    }